

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CommitBufferForInterpreter
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation,BYTE *pBuffer,size_t bufferSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JITManager *this_00;
  AutoRealOrFakeCriticalSection<CriticalSection> local_38;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  size_t bufferSize_local;
  BYTE *pBuffer_local;
  TEmitBufferAllocation *allocation_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  autoCs.cs = (CriticalSection *)bufferSize;
  AutoRealOrFakeCriticalSection<CriticalSection>::AutoRealOrFakeCriticalSection
            (&local_38,&this->criticalSection);
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1a3,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  allocation->bytesUsed = (size_t)(((autoCs.cs)->super_CCLock).mutexPtr + allocation->bytesUsed);
  this->totalBytesCode = (size_t)(((autoCs.cs)->super_CCLock).mutexPtr + this->totalBytesCode);
  if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(CustomHeapPhase,L"Setting execute permissions on 0x%p, allocation: 0x%p\n",pBuffer
                  ,allocation->allocation->address);
  }
  bVar2 = CheckCommitFaultInjection(this);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = JITManager::GetJITManager();
    bVar2 = JITManager::IsJITServer(this_00);
    if (!bVar2) {
      BVar3 = Memory::CustomHeap::
              Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
              ProtectAllocationWithExecuteReadOnly
                        (&this->allocationHeap,allocation->allocation,(char *)0x0);
      if (BVar3 == 0) {
        this_local._7_1_ = false;
        goto LAB_005184fe;
      }
    }
    BVar3 = FlushInstructionCache(this->processHandle,pBuffer,(SIZE_T)autoCs.cs);
    if (BVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
LAB_005184fe:
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_38);
  return this_local._7_1_;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBufferForInterpreter(TEmitBufferAllocation* allocation, _In_reads_bytes_(bufferSize) BYTE* pBuffer, _In_ size_t bufferSize)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(allocation != nullptr);
    allocation->bytesUsed += bufferSize;
#ifdef DEBUG
    this->totalBytesCode += bufferSize;
#endif

    VerboseHeapTrace(_u("Setting execute permissions on 0x%p, allocation: 0x%p\n"), pBuffer, allocation->allocation->address);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CheckCommitFaultInjection())
    {
        return false;
    }
#endif

    if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation))
    {
        return false;
    }

    if (!FlushInstructionCache(this->processHandle, pBuffer, bufferSize))
    {
        return false;
    }

    return true;
}